

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependConstantInt32
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,LPCWSTR clue,int value,
          ConstantSizedBufferBuilderOf<int> **entryOut)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  BufferBuilder *value_00;
  ImmutableList<Js::BufferBuilder_*> *pIVar2;
  TrackAllocData local_60;
  BufferBuilder *local_38;
  ConstantSizedBufferBuilderOf<int> *entry;
  ConstantSizedBufferBuilderOf<int> **entryOut_local;
  LPCWSTR pWStack_20;
  int value_local;
  LPCWSTR clue_local;
  BufferBuilderList *builder_local;
  ByteCodeBufferBuilder *this_local;
  
  pAVar1 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  entry = (ConstantSizedBufferBuilderOf<int> *)entryOut;
  entryOut_local._4_4_ = value;
  pWStack_20 = clue;
  clue_local = (LPCWSTR)builder;
  builder_local = (BufferBuilderList *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&ConstantSizedBufferBuilderOf<int>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
             ,0x2f6);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_60);
  value_00 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)pAVar1,0x3f67b0);
  ConstantSizedBufferBuilderOf<int>::ConstantSizedBufferBuilderOf
            ((ConstantSizedBufferBuilderOf<int> *)value_00,pWStack_20,
             (int *)((long)&entryOut_local + 4));
  local_38 = value_00;
  pIVar2 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend
                     (*(ImmutableList<Js::BufferBuilder_*> **)(clue_local + 0xc),value_00,
                      this->alloc);
  *(ImmutableList<Js::BufferBuilder_*> **)(clue_local + 0xc) = pIVar2;
  if (entry != (ConstantSizedBufferBuilderOf<int> *)0x0) {
    (entry->super_BufferBuilderOf<int,_false>).super_BufferBuilder._vptr_BufferBuilder =
         (_func_int **)local_38;
  }
  return 4;
}

Assistant:

uint32 PrependConstantInt32(BufferBuilderList & builder, LPCWSTR clue, int value, ConstantSizedBufferBuilderOf<int> ** entryOut = nullptr)
    {
        auto entry = Anew(alloc, ConstantSizedBufferBuilderOf<int>, clue, value);
        builder.list = builder.list->Prepend(entry, alloc);
        if (entryOut)
        {
            *entryOut = entry;
        }
        return sizeof(int32);
    }